

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint huffmanDecodeSymbol(LodePNGBitReader *reader,HuffmanTree_conflict *codetree)

{
  byte bVar1;
  uchar *puVar2;
  unsigned_short *puVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  ushort uVar7;
  uint uVar8;
  
  uVar5 = reader->buffer;
  puVar2 = codetree->table_len;
  puVar3 = codetree->table_value;
  bVar1 = puVar2[uVar5 & 0x1ff];
  uVar7 = puVar3[uVar5 & 0x1ff];
  if ((ulong)bVar1 < 10) {
    reader->buffer = uVar5 >> (bVar1 & 0x1f);
    reader->bp = reader->bp + (ulong)bVar1;
  }
  else {
    uVar5 = uVar5 >> 9;
    reader->buffer = uVar5;
    sVar4 = reader->bp;
    reader->bp = sVar4 + 9;
    uVar8 = (uint)uVar7 + (~(-1 << (bVar1 - 9 & 0x1f)) & uVar5) & 0xffff;
    uVar6 = puVar2[uVar8] - 9;
    reader->buffer = uVar5 >> ((byte)uVar6 & 0x1f);
    reader->bp = uVar6 + sVar4 + 9;
    uVar7 = puVar3[uVar8];
  }
  return (uint)uVar7;
}

Assistant:

static unsigned huffmanDecodeSymbol(LodePNGBitReader* reader, const HuffmanTree* codetree) {
  unsigned short code = peekBits(reader, FIRSTBITS);
  unsigned short l = codetree->table_len[code];
  unsigned short value = codetree->table_value[code];
  if(l <= FIRSTBITS) {
    advanceBits(reader, l);
    return value;
  } else {
    advanceBits(reader, FIRSTBITS);
    value += peekBits(reader, l - FIRSTBITS);
    advanceBits(reader, codetree->table_len[value] - FIRSTBITS);
    return codetree->table_value[value];
  }
}